

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pa_linux_alsa.c
# Opt level: O2

int OpenPcm(snd_pcm_t **pcmp,char *name,snd_pcm_stream_t stream,int mode,int waitOnBusy)

{
  int iVar1;
  int iVar2;
  undefined4 in_register_0000000c;
  undefined4 in_register_00000014;
  int iVar3;
  
  iVar1 = busyRetries_;
  iVar2 = snd_pcm_open(pcmp,name,CONCAT44(in_register_00000014,stream),
                       CONCAT44(in_register_0000000c,mode));
  iVar3 = 0;
  while (((waitOnBusy != 0 && (iVar3 < iVar1)) && (iVar2 == -0x10))) {
    Pa_Sleep(10);
    iVar2 = snd_pcm_open(pcmp,name,stream,mode);
    iVar3 = iVar3 + 1;
  }
  return iVar2;
}

Assistant:

static int OpenPcm( snd_pcm_t **pcmp, const char *name, snd_pcm_stream_t stream, int mode, int waitOnBusy )
{
    int ret, tries = 0, maxTries = waitOnBusy ? busyRetries_ : 0;

    ret = alsa_snd_pcm_open( pcmp, name, stream, mode );

    for( tries = 0; tries < maxTries && -EBUSY == ret; ++tries )
    {
        Pa_Sleep( 10 );
        ret = alsa_snd_pcm_open( pcmp, name, stream, mode );
        if( -EBUSY != ret )
        {
            PA_DEBUG(( "%s: Successfully opened initially busy device after %d tries\n", __FUNCTION__, tries ));
        }
    }
    if( -EBUSY == ret )
    {
        PA_DEBUG(( "%s: Failed to open busy device '%s'\n", __FUNCTION__, name ));
    }
    else
    {
        if( ret < 0 )
            PA_DEBUG(( "%s: Opened device '%s' ptr[%p] - result: [%d:%s]\n", __FUNCTION__, name, *pcmp, ret, alsa_snd_strerror(ret) ));
    }

    return ret;
}